

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::ScopedPrematureExitFile::ScopedPrematureExitFile
          (ScopedPrematureExitFile *this,char *premature_exit_filepath)

{
  ulong uVar1;
  FILE *__s;
  char *in_RSI;
  string *in_RDI;
  FILE *pfile;
  char *in_stack_ffffffffffffffa8;
  char *local_40;
  allocator local_11 [17];
  
  local_40 = in_RSI;
  if (in_RSI == (char *)0x0) {
    local_40 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,local_40,local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::c_str();
    __s = (FILE *)posix::FOpen(local_40,in_stack_ffffffffffffffa8);
    fwrite("0",1,1,__s);
    fclose(__s);
  }
  return;
}

Assistant:

explicit ScopedPrematureExitFile(const char* premature_exit_filepath)
      : premature_exit_filepath_(
            premature_exit_filepath ? premature_exit_filepath : "") {
    // If a path to the premature-exit file is specified...
    if (!premature_exit_filepath_.empty()) {
      // create the file with a single "0" character in it.  I/O
      // errors are ignored as there's nothing better we can do and we
      // don't want to fail the test because of this.
      FILE* pfile = posix::FOpen(premature_exit_filepath_.c_str(), "w");
      fwrite("0", 1, 1, pfile);
      fclose(pfile);
    }
  }